

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlat<unsigned_char,unsigned_char,unsigned_char,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftRightOperator,bool,false,true>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  byte bVar1;
  bool bVar2;
  uchar *count_00;
  TemplatedValidityMask<unsigned_long> *in_RCX;
  Vector *in_RDX;
  undefined8 in_RDI;
  byte in_R8B;
  ValidityMask *unaff_retaddr;
  idx_t in_stack_00000008;
  ValidityMask *result_validity;
  uchar *result_data;
  uchar *rdata;
  uchar *ldata;
  Vector *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 fun_00;
  
  fun_00 = (undefined1)((ulong)in_RDI >> 0x38);
  bVar1 = in_R8B & 1;
  count_00 = FlatVector::GetData<unsigned_char>((Vector *)0xe82cbb);
  FlatVector::GetData<unsigned_char>((Vector *)0xe82cca);
  bVar2 = ConstantVector::IsNull((Vector *)0xe82cd9);
  if (bVar2) {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    duckdb::ConstantVector::SetNull(in_RDX,true);
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    FlatVector::GetData<unsigned_char>((Vector *)0xe82d18);
    FlatVector::Validity((Vector *)0xe82d27);
    bVar2 = BinaryStandardOperatorWrapper::AddsNulls();
    if (bVar2) {
      FlatVector::Validity((Vector *)0xe82d4b);
      TemplatedValidityMask<unsigned_long>::Copy
                (in_RCX,(TemplatedValidityMask<unsigned_long> *)
                        CONCAT17(bVar1,in_stack_ffffffffffffffd8),(idx_t)count_00);
    }
    else {
      FlatVector::Validity((Vector *)0xe82d72);
      FlatVector::SetValidity(in_stack_ffffffffffffffb0,(ValidityMask *)in_RDX);
    }
    ExecuteFlatLoop<unsigned_char,unsigned_char,unsigned_char,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftRightOperator,bool,false,true>
              (rdata,result_data,(uchar *)result_validity,in_stack_00000008,unaff_retaddr,
               (bool)fun_00);
  }
  return;
}

Assistant:

static void ExecuteFlat(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if ((LEFT_CONSTANT && ConstantVector::IsNull(left)) || (RIGHT_CONSTANT && ConstantVector::IsNull(right))) {
			// either left or right is constant NULL: result is constant NULL
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		auto &result_validity = FlatVector::Validity(result);
		if (LEFT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(right), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(right));
			}
		} else if (RIGHT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
			}
		} else {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
				if (result_validity.AllValid()) {
					result_validity.Copy(FlatVector::Validity(right), count);
				} else {
					result_validity.Combine(FlatVector::Validity(right), count);
				}
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
				result_validity.Combine(FlatVector::Validity(right), count);
			}
		}
		ExecuteFlatLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, result_data, count, result_validity, fun);
	}